

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O3

integer ilaenv_(integer *ispec,char *name__,char *opts,integer *n1,integer *n2,integer *n3,
               integer *n4,ftnlen name_len,ftnlen opts_len)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  integer iVar4;
  integer iVar5;
  long lVar6;
  ftnlen fVar7;
  ftnlen fVar8;
  char *pcVar9;
  char *pcVar10;
  integer *ispec_00;
  
  switch(*ispec) {
  case 1:
  case 2:
  case 3:
    s_copy(ilaenv_::subnam,name__,6,name_len);
    uVar2 = (uint)(byte)ilaenv_::subnam[0];
    if (uVar2 - 0x61 < 0x1a) {
      ilaenv_::subnam[0] = ilaenv_::subnam[0] + -0x20;
      lVar6 = 1;
      do {
        if ((byte)(ilaenv_::subnam[lVar6] + 0x9fU) < 0x1a) {
          ilaenv_::subnam[lVar6] = ilaenv_::subnam[lVar6] + -0x20;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      uVar2 = (uint)(byte)ilaenv_::subnam[0];
    }
    cVar1 = (char)uVar2;
    ilaenv_::sname = (logical)(cVar1 == 'D' || cVar1 == 'S');
    ilaenv_::cname = (logical)(cVar1 == 'Z' || cVar1 == 'C');
    if (0x17 < uVar2 - 0x43) {
      return 1;
    }
    if ((0x810003U >> (uVar2 - 0x43 & 0x1f) & 1) == 0) {
      return 1;
    }
    s_copy(ilaenv_::c2,ilaenv_::subnam + 1,2,2);
    s_copy(ilaenv_::c3,ilaenv_::subnam + 3,3,3);
    s_copy(ilaenv_::c4,ilaenv_::c3 + 1,2,2);
    if (*ispec == 2) {
      ilaenv_::nbmin = 2;
      iVar4 = s_cmp(ilaenv_::c2,"GE",2,2);
      if (iVar4 == 0) {
        iVar4 = s_cmp(ilaenv_::c3,"QRF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nbmin = 2;
          return 2;
        }
        iVar4 = s_cmp(ilaenv_::c3,"RQF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nbmin = 2;
          return 2;
        }
        iVar4 = s_cmp(ilaenv_::c3,"LQF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nbmin = 2;
          return 2;
        }
        iVar4 = s_cmp(ilaenv_::c3,"QLF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nbmin = 2;
          return 2;
        }
        iVar4 = s_cmp(ilaenv_::c3,"HRD",3,3);
        if (iVar4 == 0) {
          ilaenv_::nbmin = 2;
          return 2;
        }
        iVar4 = s_cmp(ilaenv_::c3,"BRD",3,3);
        if (iVar4 == 0) {
          ilaenv_::nbmin = 2;
          return 2;
        }
        pcVar9 = "TRI";
      }
      else {
        iVar4 = s_cmp(ilaenv_::c2,"SY",2,2);
        if (iVar4 == 0) {
          iVar4 = s_cmp(ilaenv_::c3,"TRF",3,3);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 8;
            return 8;
          }
          if (ilaenv_::sname != 0) {
            iVar4 = s_cmp(ilaenv_::c3,"TRD",3,3);
            if (iVar4 == 0) {
              ilaenv_::nbmin = 2;
              return 2;
            }
            return ilaenv_::nbmin;
          }
          return ilaenv_::nbmin;
        }
        if ((ilaenv_::cname == 0) || (iVar4 = s_cmp(ilaenv_::c2,"HE",2,2), iVar4 != 0)) {
          if ((ilaenv_::sname == 0) || (iVar4 = s_cmp(ilaenv_::c2,"OR",2,2), iVar4 != 0)) {
            if (ilaenv_::cname == 0) {
              return ilaenv_::nbmin;
            }
            iVar4 = s_cmp(ilaenv_::c2,"UN",2,2);
            if (iVar4 != 0) {
              return ilaenv_::nbmin;
            }
          }
          if ((ilaenv_::c3[0] != 'M') && (ilaenv_::c3[0] != 'G')) {
            return ilaenv_::nbmin;
          }
          iVar4 = s_cmp(ilaenv_::c4,"QR",2,2);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 2;
            return 2;
          }
          iVar4 = s_cmp(ilaenv_::c4,"RQ",2,2);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 2;
            return 2;
          }
          iVar4 = s_cmp(ilaenv_::c4,"LQ",2,2);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 2;
            return 2;
          }
          iVar4 = s_cmp(ilaenv_::c4,"QL",2,2);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 2;
            return 2;
          }
          iVar4 = s_cmp(ilaenv_::c4,"HR",2,2);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 2;
            return 2;
          }
          iVar4 = s_cmp(ilaenv_::c4,"TR",2,2);
          if (iVar4 == 0) {
            ilaenv_::nbmin = 2;
            return 2;
          }
          pcVar10 = ilaenv_::c4;
          pcVar9 = "BR";
          fVar8 = 2;
          fVar7 = 2;
          goto LAB_00117b49;
        }
        pcVar9 = "TRD";
      }
      pcVar10 = ilaenv_::c3;
      fVar8 = 3;
      fVar7 = 3;
LAB_00117b49:
      iVar4 = s_cmp(pcVar10,pcVar9,fVar8,fVar7);
      if (iVar4 == 0) {
        ilaenv_::nbmin = 2;
        return 2;
      }
      return ilaenv_::nbmin;
    }
    if (*ispec == 3) {
      ilaenv_::nx = 0;
      iVar4 = s_cmp(ilaenv_::c2,"GE",2,2);
      if (iVar4 == 0) {
        iVar4 = s_cmp(ilaenv_::c3,"QRF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c3,"RQF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c3,"LQF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c3,"QLF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c3,"HRD",3,3);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        pcVar10 = ilaenv_::c3;
        pcVar9 = "BRD";
        fVar8 = 3;
        fVar7 = 3;
LAB_001177bc:
        iVar4 = s_cmp(pcVar10,pcVar9,fVar8,fVar7);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        return ilaenv_::nx;
      }
      iVar4 = s_cmp(ilaenv_::c2,"SY",2,2);
      if (iVar4 == 0) {
        if (ilaenv_::sname == 0) {
          return ilaenv_::nx;
        }
      }
      else if ((ilaenv_::cname == 0) || (iVar4 = s_cmp(ilaenv_::c2,"HE",2,2), iVar4 != 0)) {
        if ((ilaenv_::sname == 0) || (iVar4 = s_cmp(ilaenv_::c2,"OR",2,2), iVar4 != 0)) {
          if (ilaenv_::cname == 0) {
            return ilaenv_::nx;
          }
          iVar4 = s_cmp(ilaenv_::c2,"UN",2,2);
          if (iVar4 != 0) {
            return ilaenv_::nx;
          }
        }
        if (ilaenv_::c3[0] != 'G') {
          return ilaenv_::nx;
        }
        iVar4 = s_cmp(ilaenv_::c4,"QR",2,2);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c4,"RQ",2,2);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c4,"LQ",2,2);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c4,"QL",2,2);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c4,"HR",2,2);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        iVar4 = s_cmp(ilaenv_::c4,"TR",2,2);
        if (iVar4 == 0) {
          ilaenv_::nx = 0x80;
          return 0x80;
        }
        pcVar10 = ilaenv_::c4;
        pcVar9 = "BR";
        fVar8 = 2;
        fVar7 = 2;
        goto LAB_001177bc;
      }
      iVar4 = s_cmp(ilaenv_::c3,"TRD",3,3);
      if (iVar4 == 0) {
        ilaenv_::nx = 0x20;
        return 0x20;
      }
      return ilaenv_::nx;
    }
    ilaenv_::nb = 1;
    iVar4 = s_cmp(ilaenv_::c2,"GE",2,2);
    if (iVar4 == 0) {
      iVar4 = s_cmp(ilaenv_::c3,"TRF",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x40;
        return 0x40;
      }
      iVar4 = s_cmp(ilaenv_::c3,"QRF",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x20;
        return 0x20;
      }
      iVar4 = s_cmp(ilaenv_::c3,"RQF",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x20;
        return 0x20;
      }
      iVar4 = s_cmp(ilaenv_::c3,"LQF",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x20;
        return 0x20;
      }
      iVar4 = s_cmp(ilaenv_::c3,"QLF",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x20;
        return 0x20;
      }
      iVar4 = s_cmp(ilaenv_::c3,"HRD",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x20;
        return 0x20;
      }
      iVar4 = s_cmp(ilaenv_::c3,"BRD",3,3);
      if (iVar4 == 0) {
        ilaenv_::nb = 0x20;
        return 0x20;
      }
      iVar3 = s_cmp(ilaenv_::c3,"TRI",3,3);
      iVar4 = 0x40;
LAB_00117ce4:
      if (iVar3 != 0) {
        return ilaenv_::nb;
      }
    }
    else {
      iVar4 = s_cmp(ilaenv_::c2,"PO",2,2);
      if (iVar4 == 0) {
        pcVar9 = "TRF";
LAB_00117aa2:
        iVar4 = s_cmp(ilaenv_::c3,pcVar9,3,3);
        if (iVar4 == 0) {
          ilaenv_::nb = 0x40;
          return 0x40;
        }
        return ilaenv_::nb;
      }
      iVar4 = s_cmp(ilaenv_::c2,"SY",2,2);
      if (iVar4 == 0) {
        iVar4 = s_cmp(ilaenv_::c3,"TRF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nb = 0x40;
          return 0x40;
        }
        if (ilaenv_::sname == 0) {
          return ilaenv_::nb;
        }
        iVar4 = s_cmp(ilaenv_::c3,"TRD",3,3);
        if (iVar4 != 0) {
          if (ilaenv_::sname == 0) {
            return ilaenv_::nb;
          }
LAB_00117cc7:
          iVar4 = 0x40;
          pcVar10 = ilaenv_::c3;
          pcVar9 = "GST";
          fVar8 = 3;
          fVar7 = 3;
          goto LAB_00117cdf;
        }
      }
      else {
        if ((ilaenv_::cname == 0) || (iVar4 = s_cmp(ilaenv_::c2,"HE",2,2), iVar4 != 0)) {
          if (((ilaenv_::sname == 0) || (iVar4 = s_cmp(ilaenv_::c2,"OR",2,2), iVar4 != 0)) &&
             ((ilaenv_::cname == 0 || (iVar4 = s_cmp(ilaenv_::c2,"UN",2,2), iVar4 != 0)))) {
            iVar4 = s_cmp(ilaenv_::c2,"GB",2,2);
            if (iVar4 == 0) {
              iVar3 = s_cmp(ilaenv_::c3,"TRF",3,3);
              n2 = n4;
            }
            else {
              iVar4 = s_cmp(ilaenv_::c2,"PB",2,2);
              if (iVar4 != 0) {
                iVar4 = s_cmp(ilaenv_::c2,"TR",2,2);
                if (iVar4 == 0) {
                  pcVar9 = "TRI";
                }
                else {
                  iVar4 = s_cmp(ilaenv_::c2,"LA",2,2);
                  if (iVar4 != 0) {
                    if (ilaenv_::sname == 0) {
                      return ilaenv_::nb;
                    }
                    iVar4 = s_cmp(ilaenv_::c2,"ST",2,2);
                    if (iVar4 == 0) {
                      iVar4 = s_cmp(ilaenv_::c3,"EBZ",3,3);
                      if (iVar4 == 0) {
                        ilaenv_::nb = 1;
                        return 1;
                      }
                      return ilaenv_::nb;
                    }
                    return ilaenv_::nb;
                  }
                  pcVar9 = "UUM";
                }
                goto LAB_00117aa2;
              }
              iVar3 = s_cmp(ilaenv_::c3,"TRF",3,3);
            }
            if (iVar3 != 0) {
              return ilaenv_::nb;
            }
            if (0x40 < *n2) {
              ilaenv_::nb = 0x20;
              return 0x20;
            }
            ilaenv_::nb = 1;
            return 1;
          }
          if ((ilaenv_::c3[0] != 'M') && (ilaenv_::c3[0] != 'G')) {
            return ilaenv_::nb;
          }
          iVar5 = s_cmp(ilaenv_::c4,"QR",2,2);
          iVar4 = 0x20;
          if (iVar5 == 0) {
            ilaenv_::nb = 0x20;
            return 0x20;
          }
          iVar5 = s_cmp(ilaenv_::c4,"RQ",2,2);
          if (iVar5 == 0) {
            ilaenv_::nb = 0x20;
            return 0x20;
          }
          iVar5 = s_cmp(ilaenv_::c4,"LQ",2,2);
          if (iVar5 == 0) {
            ilaenv_::nb = 0x20;
            return 0x20;
          }
          iVar5 = s_cmp(ilaenv_::c4,"QL",2,2);
          if (iVar5 == 0) {
            ilaenv_::nb = 0x20;
            return 0x20;
          }
          iVar5 = s_cmp(ilaenv_::c4,"HR",2,2);
          if (iVar5 == 0) {
            ilaenv_::nb = 0x20;
            return 0x20;
          }
          iVar5 = s_cmp(ilaenv_::c4,"TR",2,2);
          if (iVar5 == 0) {
            ilaenv_::nb = 0x20;
            return 0x20;
          }
          pcVar10 = ilaenv_::c4;
          pcVar9 = "BR";
          fVar8 = 2;
          fVar7 = 2;
LAB_00117cdf:
          iVar3 = s_cmp(pcVar10,pcVar9,fVar8,fVar7);
          goto LAB_00117ce4;
        }
        iVar4 = s_cmp(ilaenv_::c3,"TRF",3,3);
        if (iVar4 == 0) {
          ilaenv_::nb = 0x40;
          return 0x40;
        }
        iVar4 = s_cmp(ilaenv_::c3,"TRD",3,3);
        if (iVar4 != 0) goto LAB_00117cc7;
      }
      iVar4 = 0x20;
    }
    ilaenv_::nb = iVar4;
    return iVar4;
  case 4:
    iVar3 = 6;
    break;
  case 5:
    iVar3 = 2;
    break;
  case 6:
    iVar3 = *n2;
    if (*n1 < *n2) {
      iVar3 = *n1;
    }
    iVar3 = (int)((float)iVar3 * 1.6);
    break;
  case 7:
    iVar3 = 1;
    break;
  case 8:
    iVar3 = 0x32;
    break;
  case 9:
    iVar3 = 0x19;
    break;
  case 10:
    ispec_00 = &c__0;
    goto LAB_0011728d;
  case 0xb:
    ispec_00 = &c__1;
LAB_0011728d:
    iVar4 = ieeeck_(ispec_00,&c_b163,&c_b164);
    return iVar4;
  default:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

integer ilaenv_(integer *ispec, char *name__, char *opts, integer *n1,
	integer *n2, integer *n3, integer *n4, ftnlen name_len, ftnlen
	opts_len)
{
    /* System generated locals */
    integer ret_val;

    /* Builtin functions */
    /* Subroutine */ int s_copy(char *, char *, ftnlen, ftnlen);
    integer s_cmp(char *, char *, ftnlen, ftnlen);

    /* Local variables */
    static integer i__;
    static char c1[1], c2[2], c3[3], c4[2];
    static integer ic, nb, iz, nx;
    static logical cname, sname;
    static integer nbmin;
    extern integer ieeeck_(integer *, real *, real *);
    static char subnam[6];


/*
    -- LAPACK auxiliary routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       June 30, 1999


    Purpose
    =======

    ILAENV is called from the LAPACK routines to choose problem-dependent
    parameters for the local environment.  See ISPEC for a description of
    the parameters.

    This version provides a set of parameters which should give good,
    but not optimal, performance on many of the currently available
    computers.  Users are encouraged to modify this subroutine to set
    the tuning parameters for their particular machine using the option
    and problem size information in the arguments.

    This routine will not function correctly if it is converted to all
    lower case.  Converting it to all upper case is allowed.

    Arguments
    =========

    ISPEC   (input) INTEGER
            Specifies the parameter to be returned as the value of
            ILAENV.
            = 1: the optimal blocksize; if this value is 1, an unblocked
                 algorithm will give the best performance.
            = 2: the minimum block size for which the block routine
                 should be used; if the usable block size is less than
                 this value, an unblocked routine should be used.
            = 3: the crossover point (in a block routine, for N less
                 than this value, an unblocked routine should be used)
            = 4: the number of shifts, used in the nonsymmetric
                 eigenvalue routines
            = 5: the minimum column dimension for blocking to be used;
                 rectangular blocks must have dimension at least k by m,
                 where k is given by ILAENV(2,...) and m by ILAENV(5,...)
            = 6: the crossover point for the SVD (when reducing an m by n
                 matrix to bidiagonal form, if max(m,n)/min(m,n) exceeds
                 this value, a QR factorization is used first to reduce
                 the matrix to a triangular form.)
            = 7: the number of processors
            = 8: the crossover point for the multishift QR and QZ methods
                 for nonsymmetric eigenvalue problems.
            = 9: maximum size of the subproblems at the bottom of the
                 computation tree in the divide-and-conquer algorithm
                 (used by xGELSD and xGESDD)
            =10: ieee NaN arithmetic can be trusted not to trap
            =11: infinity arithmetic can be trusted not to trap

    NAME    (input) CHARACTER*(*)
            The name of the calling subroutine, in either upper case or
            lower case.

    OPTS    (input) CHARACTER*(*)
            The character options to the subroutine NAME, concatenated
            into a single character string.  For example, UPLO = 'U',
            TRANS = 'T', and DIAG = 'N' for a triangular routine would
            be specified as OPTS = 'UTN'.

    N1      (input) INTEGER
    N2      (input) INTEGER
    N3      (input) INTEGER
    N4      (input) INTEGER
            Problem dimensions for the subroutine NAME; these may not all
            be required.

   (ILAENV) (output) INTEGER
            >= 0: the value of the parameter specified by ISPEC
            < 0:  if ILAENV = -k, the k-th argument had an illegal value.

    Further Details
    ===============

    The following conventions have been used when calling ILAENV from the
    LAPACK routines:
    1)  OPTS is a concatenation of all of the character options to
        subroutine NAME, in the same order that they appear in the
        argument list for NAME, even if they are not used in determining
        the value of the parameter specified by ISPEC.
    2)  The problem dimensions N1, N2, N3, N4 are specified in the order
        that they appear in the argument list for NAME.  N1 is used
        first, N2 second, and so on, and unused problem dimensions are
        passed a value of -1.
    3)  The parameter value returned by ILAENV is checked for validity in
        the calling subroutine.  For example, ILAENV is used to retrieve
        the optimal blocksize for STRTRI as follows:

        NB = ILAENV( 1, 'STRTRI', UPLO // DIAG, N, -1, -1, -1 )
        IF( NB.LE.1 ) NB = MAX( 1, N )

    =====================================================================
*/


    switch (*ispec) {
	case 1:  goto L100;
	case 2:  goto L100;
	case 3:  goto L100;
	case 4:  goto L400;
	case 5:  goto L500;
	case 6:  goto L600;
	case 7:  goto L700;
	case 8:  goto L800;
	case 9:  goto L900;
	case 10:  goto L1000;
	case 11:  goto L1100;
    }

/*     Invalid value for ISPEC */

    ret_val = -1;
    return ret_val;

L100:

/*     Convert NAME to upper case if the first character is lower case. */

    ret_val = 1;
    s_copy(subnam, name__, (ftnlen)6, name_len);
    ic = *(unsigned char *)subnam;
    iz = 'Z';
    if (iz == 90 || iz == 122) {

/*        ASCII character set */

	if (ic >= 97 && ic <= 122) {
	    *(unsigned char *)subnam = (char) (ic - 32);
	    for (i__ = 2; i__ <= 6; ++i__) {
		ic = *(unsigned char *)&subnam[i__ - 1];
		if (ic >= 97 && ic <= 122) {
		    *(unsigned char *)&subnam[i__ - 1] = (char) (ic - 32);
		}
/* L10: */
	    }
	}

    } else if (iz == 233 || iz == 169) {

/*        EBCDIC character set */

	if ((ic >= 129 && ic <= 137) || (ic >= 145 && ic <= 153) || (ic >= 162 &&
		ic <= 169)) {
	    *(unsigned char *)subnam = (char) (ic + 64);
	    for (i__ = 2; i__ <= 6; ++i__) {
		ic = *(unsigned char *)&subnam[i__ - 1];
		if ((ic >= 129 && ic <= 137) || (ic >= 145 && ic <= 153) || (ic >=
			162 && ic <= 169)) {
		    *(unsigned char *)&subnam[i__ - 1] = (char) (ic + 64);
		}
/* L20: */
	    }
	}

    } else if (iz == 218 || iz == 250) {

/*        Prime machines:  ASCII+128 */

	if (ic >= 225 && ic <= 250) {
	    *(unsigned char *)subnam = (char) (ic - 32);
	    for (i__ = 2; i__ <= 6; ++i__) {
		ic = *(unsigned char *)&subnam[i__ - 1];
		if (ic >= 225 && ic <= 250) {
		    *(unsigned char *)&subnam[i__ - 1] = (char) (ic - 32);
		}
/* L30: */
	    }
	}
    }

    *(unsigned char *)c1 = *(unsigned char *)subnam;
    sname = *(unsigned char *)c1 == 'S' || *(unsigned char *)c1 == 'D';
    cname = *(unsigned char *)c1 == 'C' || *(unsigned char *)c1 == 'Z';
    if (! (cname || sname)) {
	return ret_val;
    }
    s_copy(c2, subnam + 1, (ftnlen)2, (ftnlen)2);
    s_copy(c3, subnam + 3, (ftnlen)3, (ftnlen)3);
    s_copy(c4, c3 + 1, (ftnlen)2, (ftnlen)2);

    switch (*ispec) {
	case 1:  goto L110;
	case 2:  goto L200;
	case 3:  goto L300;
    }

L110:

/*
       ISPEC = 1:  block size

       In these examples, separate code is provided for setting NB for
       real and complex.  We assume that NB will take the same value in
       single or double precision.
*/

    nb = 1;

    if (s_cmp(c2, "GE", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 64;
	    } else {
		nb = 64;
	    }
	} else if (s_cmp(c3, "QRF", (ftnlen)3, (ftnlen)3) == 0 || s_cmp(c3,
		"RQF", (ftnlen)3, (ftnlen)3) == 0 || s_cmp(c3, "LQF", (ftnlen)
		3, (ftnlen)3) == 0 || s_cmp(c3, "QLF", (ftnlen)3, (ftnlen)3)
		== 0) {
	    if (sname) {
		nb = 32;
	    } else {
		nb = 32;
	    }
	} else if (s_cmp(c3, "HRD", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 32;
	    } else {
		nb = 32;
	    }
	} else if (s_cmp(c3, "BRD", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 32;
	    } else {
		nb = 32;
	    }
	} else if (s_cmp(c3, "TRI", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 64;
	    } else {
		nb = 64;
	    }
	}
    } else if (s_cmp(c2, "PO", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 64;
	    } else {
		nb = 64;
	    }
	}
    } else if (s_cmp(c2, "SY", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 64;
	    } else {
		nb = 64;
	    }
	} else if (sname && s_cmp(c3, "TRD", (ftnlen)3, (ftnlen)3) == 0) {
	    nb = 32;
	} else if (sname && s_cmp(c3, "GST", (ftnlen)3, (ftnlen)3) == 0) {
	    nb = 64;
	}
    } else if (cname && s_cmp(c2, "HE", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    nb = 64;
	} else if (s_cmp(c3, "TRD", (ftnlen)3, (ftnlen)3) == 0) {
	    nb = 32;
	} else if (s_cmp(c3, "GST", (ftnlen)3, (ftnlen)3) == 0) {
	    nb = 64;
	}
    } else if (sname && s_cmp(c2, "OR", (ftnlen)2, (ftnlen)2) == 0) {
	if (*(unsigned char *)c3 == 'G') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nb = 32;
	    }
	} else if (*(unsigned char *)c3 == 'M') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nb = 32;
	    }
	}
    } else if (cname && s_cmp(c2, "UN", (ftnlen)2, (ftnlen)2) == 0) {
	if (*(unsigned char *)c3 == 'G') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nb = 32;
	    }
	} else if (*(unsigned char *)c3 == 'M') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nb = 32;
	    }
	}
    } else if (s_cmp(c2, "GB", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		if (*n4 <= 64) {
		    nb = 1;
		} else {
		    nb = 32;
		}
	    } else {
		if (*n4 <= 64) {
		    nb = 1;
		} else {
		    nb = 32;
		}
	    }
	}
    } else if (s_cmp(c2, "PB", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		if (*n2 <= 64) {
		    nb = 1;
		} else {
		    nb = 32;
		}
	    } else {
		if (*n2 <= 64) {
		    nb = 1;
		} else {
		    nb = 32;
		}
	    }
	}
    } else if (s_cmp(c2, "TR", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRI", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 64;
	    } else {
		nb = 64;
	    }
	}
    } else if (s_cmp(c2, "LA", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "UUM", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nb = 64;
	    } else {
		nb = 64;
	    }
	}
    } else if (sname && s_cmp(c2, "ST", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "EBZ", (ftnlen)3, (ftnlen)3) == 0) {
	    nb = 1;
	}
    }
    ret_val = nb;
    return ret_val;

L200:

/*     ISPEC = 2:  minimum block size */

    nbmin = 2;
    if (s_cmp(c2, "GE", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "QRF", (ftnlen)3, (ftnlen)3) == 0 || s_cmp(c3, "RQF", (
		ftnlen)3, (ftnlen)3) == 0 || s_cmp(c3, "LQF", (ftnlen)3, (
		ftnlen)3) == 0 || s_cmp(c3, "QLF", (ftnlen)3, (ftnlen)3) == 0)
		 {
	    if (sname) {
		nbmin = 2;
	    } else {
		nbmin = 2;
	    }
	} else if (s_cmp(c3, "HRD", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nbmin = 2;
	    } else {
		nbmin = 2;
	    }
	} else if (s_cmp(c3, "BRD", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nbmin = 2;
	    } else {
		nbmin = 2;
	    }
	} else if (s_cmp(c3, "TRI", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nbmin = 2;
	    } else {
		nbmin = 2;
	    }
	}
    } else if (s_cmp(c2, "SY", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRF", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nbmin = 8;
	    } else {
		nbmin = 8;
	    }
	} else if (sname && s_cmp(c3, "TRD", (ftnlen)3, (ftnlen)3) == 0) {
	    nbmin = 2;
	}
    } else if (cname && s_cmp(c2, "HE", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRD", (ftnlen)3, (ftnlen)3) == 0) {
	    nbmin = 2;
	}
    } else if (sname && s_cmp(c2, "OR", (ftnlen)2, (ftnlen)2) == 0) {
	if (*(unsigned char *)c3 == 'G') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nbmin = 2;
	    }
	} else if (*(unsigned char *)c3 == 'M') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nbmin = 2;
	    }
	}
    } else if (cname && s_cmp(c2, "UN", (ftnlen)2, (ftnlen)2) == 0) {
	if (*(unsigned char *)c3 == 'G') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nbmin = 2;
	    }
	} else if (*(unsigned char *)c3 == 'M') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nbmin = 2;
	    }
	}
    }
    ret_val = nbmin;
    return ret_val;

L300:

/*     ISPEC = 3:  crossover point */

    nx = 0;
    if (s_cmp(c2, "GE", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "QRF", (ftnlen)3, (ftnlen)3) == 0 || s_cmp(c3, "RQF", (
		ftnlen)3, (ftnlen)3) == 0 || s_cmp(c3, "LQF", (ftnlen)3, (
		ftnlen)3) == 0 || s_cmp(c3, "QLF", (ftnlen)3, (ftnlen)3) == 0)
		 {
	    if (sname) {
		nx = 128;
	    } else {
		nx = 128;
	    }
	} else if (s_cmp(c3, "HRD", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nx = 128;
	    } else {
		nx = 128;
	    }
	} else if (s_cmp(c3, "BRD", (ftnlen)3, (ftnlen)3) == 0) {
	    if (sname) {
		nx = 128;
	    } else {
		nx = 128;
	    }
	}
    } else if (s_cmp(c2, "SY", (ftnlen)2, (ftnlen)2) == 0) {
	if (sname && s_cmp(c3, "TRD", (ftnlen)3, (ftnlen)3) == 0) {
	    nx = 32;
	}
    } else if (cname && s_cmp(c2, "HE", (ftnlen)2, (ftnlen)2) == 0) {
	if (s_cmp(c3, "TRD", (ftnlen)3, (ftnlen)3) == 0) {
	    nx = 32;
	}
    } else if (sname && s_cmp(c2, "OR", (ftnlen)2, (ftnlen)2) == 0) {
	if (*(unsigned char *)c3 == 'G') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nx = 128;
	    }
	}
    } else if (cname && s_cmp(c2, "UN", (ftnlen)2, (ftnlen)2) == 0) {
	if (*(unsigned char *)c3 == 'G') {
	    if (s_cmp(c4, "QR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "RQ",
		    (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "LQ", (ftnlen)2, (
		    ftnlen)2) == 0 || s_cmp(c4, "QL", (ftnlen)2, (ftnlen)2) ==
		     0 || s_cmp(c4, "HR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(
		    c4, "TR", (ftnlen)2, (ftnlen)2) == 0 || s_cmp(c4, "BR", (
		    ftnlen)2, (ftnlen)2) == 0) {
		nx = 128;
	    }
	}
    }
    ret_val = nx;
    return ret_val;

L400:

/*     ISPEC = 4:  number of shifts (used by xHSEQR) */

    ret_val = 6;
    return ret_val;

L500:

/*     ISPEC = 5:  minimum column dimension (not used) */

    ret_val = 2;
    return ret_val;

L600:

/*     ISPEC = 6:  crossover point for SVD (used by xGELSS and xGESVD) */

    ret_val = (integer) ((real) min(*n1,*n2) * 1.6f);
    return ret_val;

L700:

/*     ISPEC = 7:  number of processors (not used) */

    ret_val = 1;
    return ret_val;

L800:

/*     ISPEC = 8:  crossover point for multishift (used by xHSEQR) */

    ret_val = 50;
    return ret_val;

L900:

/*
       ISPEC = 9:  maximum size of the subproblems at the bottom of the
                   computation tree in the divide-and-conquer algorithm
                   (used by xGELSD and xGESDD)
*/

    ret_val = 25;
    return ret_val;

L1000:

/*
       ISPEC = 10: ieee NaN arithmetic can be trusted not to trap

       ILAENV = 0
*/
    ret_val = 1;
    if (ret_val == 1) {
	ret_val = ieeeck_(&c__0, &c_b163, &c_b164);
    }
    return ret_val;

L1100:

/*
       ISPEC = 11: infinity arithmetic can be trusted not to trap

       ILAENV = 0
*/
    ret_val = 1;
    if (ret_val == 1) {
	ret_val = ieeeck_(&c__1, &c_b163, &c_b164);
    }
    return ret_val;

/*     End of ILAENV */

}